

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_rock_sample.cpp
# Opt level: O2

void __thiscall
despot::SimpleRockSample::PrintBelief(SimpleRockSample *this,Belief *belief,ostream *out)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long *plVar4;
  ostream *poVar5;
  long lVar6;
  allocator_type local_39;
  double local_38;
  vector<double,_std::allocator<double>_> pos_probs;
  
  plVar4 = (long *)(**(code **)(*(long *)belief + 0x30))(belief);
  std::vector<double,_std::allocator<double>_>::vector(&pos_probs,3,&local_39);
  lVar1 = *plVar4;
  lVar2 = plVar4[1];
  local_38 = 0.0;
  for (lVar6 = 0; lVar2 - lVar1 >> 3 != lVar6; lVar6 = lVar6 + 1) {
    lVar3 = *(long *)(lVar1 + lVar6 * 8);
    local_38 = local_38 + (double)*(int *)(lVar3 + 0x24) * *(double *)(lVar3 + 0x18);
    pos_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start[*(int *)(lVar3 + 0x20)] =
         *(double *)(lVar3 + 0x18) +
         pos_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_start[*(int *)(lVar3 + 0x20)];
  }
  std::operator<<(out,"Rock belief: ");
  poVar5 = std::ostream::_M_insert<double>(local_38);
  std::endl<char,std::char_traits<char>>(poVar5);
  poVar5 = std::operator<<(out,"Position belief:");
  poVar5 = std::operator<<(poVar5," LEFT");
  std::operator<<(poVar5,":");
  poVar5 = std::ostream::_M_insert<double>
                     (*pos_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start);
  poVar5 = std::operator<<(poVar5," MIDDLE");
  std::operator<<(poVar5,":");
  poVar5 = std::ostream::_M_insert<double>
                     (pos_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[1]);
  poVar5 = std::operator<<(poVar5," RIGHT");
  std::operator<<(poVar5,":");
  poVar5 = std::ostream::_M_insert<double>
                     (pos_probs.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start[2]);
  std::endl<char,std::char_traits<char>>(poVar5);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&pos_probs.super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

void SimpleRockSample::PrintBelief(const Belief& belief, ostream& out) const {
	const vector<State*>& particles =
		static_cast<const ParticleBelief&>(belief).particles();

	double rock_status = 0;
	vector<double> pos_probs(3);
	for (int i = 0; i < particles.size(); i++) {
		State* particle = particles[i];
		const SimpleState* state = static_cast<const SimpleState*>(particle);
		rock_status += state->rock_status * particle->weight;
		pos_probs[state->rover_position] += particle->weight;
	}

	out << "Rock belief: " << rock_status << endl;

	out << "Position belief:" << " LEFT" << ":" << pos_probs[0] << " MIDDLE"
		<< ":" << pos_probs[1] << " RIGHT" << ":" << pos_probs[2] << endl;
}